

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void load_replay_kvs(storage_t *st,fdb_kvs_handle *replay_kvs,fdb_seqnum_t seqnum)

{
  void *pvVar1;
  short sVar2;
  fdb_status fVar3;
  fdb_doc *rdoc;
  fdb_iterator *it;
  timeval __test_begin;
  fdb_doc *local_38;
  fdb_iterator *local_30;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  local_38 = (fdb_doc *)0x0;
  fVar3 = fdb_iterator_sequence_init(st->rtx,&local_30,0,seqnum,0);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
            ,0x129);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                  ,0x129,"void load_replay_kvs(storage_t *, fdb_kvs_handle *, fdb_seqnum_t)");
  }
  while( true ) {
    fVar3 = fdb_iterator_get(local_30,&local_38);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x12d);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x12d,"void load_replay_kvs(storage_t *, fdb_kvs_handle *, fdb_seqnum_t)");
    }
    pvVar1 = local_38->body;
    sVar2 = *(short *)((long)pvVar1 + 0x410);
    if (sVar2 == 1) {
      fVar3 = fdb_set_kv(replay_kvs,(void *)((long)pvVar1 + 4),*(size_t *)((long)pvVar1 + 0x408),
                         (void *)0x0,0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x135);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x135,"void load_replay_kvs(storage_t *, fdb_kvs_handle *, fdb_seqnum_t)");
      }
      sVar2 = *(short *)((long)pvVar1 + 0x410);
    }
    if ((sVar2 == 2) &&
       (fVar3 = fdb_del_kv(replay_kvs,(void *)((long)pvVar1 + 4),*(size_t *)((long)pvVar1 + 0x408)),
       fVar3 != FDB_RESULT_SUCCESS)) break;
    fdb_doc_free(local_38);
    local_38 = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_next(local_30);
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
      fdb_iterator_close(local_30);
      return;
    }
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
          ,0x13b);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x13b,"void load_replay_kvs(storage_t *, fdb_kvs_handle *, fdb_seqnum_t)");
}

Assistant:

void load_replay_kvs(storage_t *st, fdb_kvs_handle *replay_kvs, fdb_seqnum_t seqnum) {

    TEST_INIT();

    fdb_iterator *it;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    transaction_t *tx;


    // iterator end at seqnum
    status = fdb_iterator_sequence_init(st->rtx, &it, 0, seqnum,
                                        FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        tx = (transaction_t *)rdoc->body;
        if (tx->type == SET_PERSON) {
            status = fdb_set_kv(replay_kvs,
                                tx->refkey,
                                tx->refkey_len,
                                NULL,0);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        if (tx->type == DEL_PERSON) {
            status = fdb_del_kv(replay_kvs,
                                tx->refkey,
                                tx->refkey_len);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc=NULL;

    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

}